

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerLdWasmFunc(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  byte bVar5;
  OpndKind OVar6;
  int32 iVar7;
  RegOpnd *pRVar8;
  undefined4 *puVar9;
  IntConstOpnd *pIVar10;
  Opnd *pOVar11;
  IndirOpnd *compareSrc2;
  IndirOpnd *src;
  LabelInstr *target;
  LabelInstr *target_00;
  LabelInstr *target_01;
  Lowerer *pLVar12;
  IndirOpnd *local_48;
  
  pIVar1 = instr->m_prev;
  pRVar8 = (RegOpnd *)IR::Instr::UnlinkSrc1(instr);
  OVar3 = IR::Opnd::GetKind((Opnd *)pRVar8);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_005b0f65;
    *puVar9 = 0;
  }
  pIVar10 = (IntConstOpnd *)IR::Instr::UnlinkSrc2(instr);
  pOVar11 = IR::Instr::UnlinkDst(instr);
  compareSrc2 = IR::IndirOpnd::New(pRVar8,0x28,TyUint32,this->m_func,false);
  src = IR::IndirOpnd::New(pRVar8,0x30,TyUint64,this->m_func,false);
  pRVar8 = IR::RegOpnd::New(TyUint64,this->m_func);
  bVar5 = LowererMDArch::GetDefaultIndirScale();
  OVar3 = IR::Opnd::GetKind((Opnd *)pIVar10);
  OVar6 = IR::Opnd::GetKind((Opnd *)pIVar10);
  if (OVar3 == OpndKindIntConst) {
    if (OVar6 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar4) {
LAB_005b0f65:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    iVar7 = IR::IntConstOpnd::AsInt32(pIVar10);
    local_48 = IR::IndirOpnd::New(pRVar8,iVar7 << (bVar5 & 0x1f),TyUint64,this->m_func,false);
  }
  else {
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x21a7,"(indexOpnd->IsRegOpnd())","indexOpnd->IsRegOpnd()");
      if (!bVar4) goto LAB_005b0f65;
      *puVar9 = 0;
    }
    OVar3 = IR::Opnd::GetKind((Opnd *)pIVar10);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_005b0f65;
      *puVar9 = 0;
    }
    local_48 = IR::IndirOpnd::New(pRVar8,(RegOpnd *)pIVar10,TyUint64,this->m_func);
    local_48->m_scale = bVar5;
  }
  target = IR::LabelInstr::New(Label,instr->m_func,true);
  IR::Instr::InsertBefore(instr,&target->super_Instr);
  target_00 = InsertLabel(true,&target->super_Instr);
  pLVar12 = (Lowerer *)0x0;
  target_01 = InsertLabel(false,instr->m_next);
  InsertCompareBranch(pLVar12,(Opnd *)pIVar10,&compareSrc2->super_Opnd,BrGe_A,true,target,
                      &target_00->super_Instr,false);
  InsertMove(&pRVar8->super_Opnd,&src->super_Opnd,&target_00->super_Instr,true);
  InsertMove(pOVar11,&local_48->super_Opnd,&target_00->super_Instr,true);
  pLVar12 = (Lowerer *)0x0;
  pIVar10 = IR::IntConstOpnd::New(0,TyUint64,this->m_func,false);
  InsertCompareBranch(pLVar12,pOVar11,&pIVar10->super_Opnd,BrEq_A,false,target_00,
                      &target_00->super_Instr,false);
  InsertBranch(Br,false,target_01,&target_00->super_Instr);
  pOVar11 = IR::IntConstOpnd::NewFromType(0x1b65,TyInt32,this->m_func);
  GenerateThrow(this,pOVar11,&target->super_Instr);
  pOVar11 = IR::IntConstOpnd::NewFromType(0x1b68,TyInt32,this->m_func);
  GenerateThrow(this,pOVar11,instr);
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerLdWasmFunc(IR::Instr* instr)
{
    IR::Instr * prev = instr->m_prev;

    IR::RegOpnd * tableReg = instr->UnlinkSrc1()->AsRegOpnd();

    IR::Opnd * indexOpnd = instr->UnlinkSrc2();
    IR::Opnd * dst = instr->UnlinkDst();

    IR::IndirOpnd * lengthOpnd = IR::IndirOpnd::New(tableReg, Js::WebAssemblyTable::GetOffsetOfCurrentLength(), TyUint32, m_func);
    IR::IndirOpnd * valuesIndirOpnd = IR::IndirOpnd::New(tableReg, Js::WebAssemblyTable::GetOffsetOfValues(), TyMachPtr, m_func);
    IR::RegOpnd * valuesRegOpnd = IR::RegOpnd::New(TyMachPtr, m_func);

    byte scale = m_lowererMD.GetDefaultIndirScale();
    IR::IndirOpnd * funcIndirOpnd;
    if (indexOpnd->IsIntConstOpnd())
    {
        funcIndirOpnd = IR::IndirOpnd::New(valuesRegOpnd, indexOpnd->AsIntConstOpnd()->AsInt32() << scale, TyMachPtr, m_func);
    }
    else
    {
        Assert(indexOpnd->IsRegOpnd());
        funcIndirOpnd = IR::IndirOpnd::New(valuesRegOpnd, indexOpnd->AsRegOpnd(), TyMachPtr, m_func);
        funcIndirOpnd->SetScale(scale);
    }

    IR::LabelInstr * trapOutOfBoundsLabel = InsertLabel(true, instr);
    IR::LabelInstr * trapLabel = InsertLabel(true, trapOutOfBoundsLabel);
    IR::LabelInstr * doneLabel = InsertLabel(false, instr->m_next);
    InsertCompareBranch(indexOpnd, lengthOpnd, Js::OpCode::BrGe_A, true, trapOutOfBoundsLabel, trapLabel);
    InsertMove(valuesRegOpnd, valuesIndirOpnd, trapLabel);

    InsertMove(dst, funcIndirOpnd, trapLabel);

    InsertCompareBranch(dst, IR::IntConstOpnd::New(0, TyMachPtr, m_func), Js::OpCode::BrEq_A, trapLabel, trapLabel);
    InsertBranch(Js::OpCode::Br, doneLabel, trapLabel);

    GenerateThrow(IR::IntConstOpnd::NewFromType(SCODE_CODE(WASMERR_NeedWebAssemblyFunc), TyInt32, m_func), trapOutOfBoundsLabel);
    GenerateThrow(IR::IntConstOpnd::NewFromType(SCODE_CODE(WASMERR_TableIndexOutOfRange), TyInt32, m_func), instr);

    instr->Remove();

    return prev;
}